

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

void __thiscall libtorrent::append_path(libtorrent *this,string *branch,string_view leaf)

{
  int iVar1;
  char *pcVar2;
  
  if (*(long *)(this + 8) == 0) {
    pcVar2 = (char *)0x0;
  }
  else {
    iVar1 = ::std::__cxx11::string::compare((char *)this);
    if (iVar1 != 0) {
      if (branch != (string *)0x0) {
        if (*(char *)(*(long *)this + -1 + *(long *)(this + 8)) != '/') {
          ::std::__cxx11::string::push_back((char)this);
        }
        ::std::__cxx11::string::append((char *)this,leaf._M_len);
        return;
      }
      return;
    }
    pcVar2 = *(char **)(this + 8);
  }
  ::std::__cxx11::string::_M_replace((ulong)this,0,pcVar2,leaf._M_len);
  return;
}

Assistant:

void append_path(std::string& branch, string_view leaf)
	{
		TORRENT_ASSERT(!is_complete(leaf));
		if (branch.empty() || branch == ".")
		{
			branch.assign(leaf.data(), leaf.size());
			return;
		}
		if (leaf.empty()) return;

#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
#define TORRENT_SEPARATOR_CHAR '\\'
		bool const need_sep = branch[branch.size()-1] != '\\'
			&& branch[branch.size()-1] != '/';
#else
#define TORRENT_SEPARATOR_CHAR '/'
		bool const need_sep = branch[branch.size()-1] != '/';
#endif

		if (need_sep) branch += TORRENT_SEPARATOR_CHAR;
		branch.append(leaf.data(), leaf.size());
	}